

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall
FxActionSpecialCall::Resolve(FxActionSpecialCall *this,FCompileContext *ctx)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  FxExpression **ppFVar5;
  undefined4 extraout_var_00;
  FxNameCast *this_00;
  undefined4 extraout_var_01;
  FxIntCast *this_01;
  size_t sVar6;
  uint local_28;
  uint i;
  bool failed;
  FCompileContext *ctx_local;
  FxActionSpecialCall *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    bVar1 = false;
    if (this->Self != (FxExpression *)0x0) {
      if (this->Self != (FxExpression *)0x0) {
        iVar3 = (*this->Self->_vptr_FxExpression[2])(this->Self,ctx);
        this->Self = (FxExpression *)CONCAT44(extraout_var,iVar3);
      }
      if (this->Self == (FxExpression *)0x0) {
        if (this != (FxActionSpecialCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
    }
    for (local_28 = 0;
        uVar4 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>),
        local_28 < uVar4; local_28 = local_28 + 1) {
      ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                           (ulong)local_28);
      iVar3 = (*(*ppFVar5)->_vptr_FxExpression[2])(*ppFVar5,ctx);
      ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                           (ulong)local_28);
      *ppFVar5 = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
      ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                           (ulong)local_28);
      if (*ppFVar5 == (FxExpression *)0x0) {
        bVar1 = true;
      }
      else if ((this->Special < 0) && (local_28 == 0)) {
        sVar6 = 0;
        ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
        if ((*ppFVar5)->ValueType == (PType *)TypeString) {
          this_00 = (FxNameCast *)FxExpression::operator_new((FxExpression *)0x30,sVar6);
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          FxNameCast::FxNameCast(this_00,*ppFVar5);
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          *ppFVar5 = (FxExpression *)this_00;
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          iVar3 = (*(*ppFVar5)->_vptr_FxExpression[2])(*ppFVar5,ctx);
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          *ppFVar5 = (FxExpression *)CONCAT44(extraout_var_01,iVar3);
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          if (*ppFVar5 == (FxExpression *)0x0) {
            bVar1 = true;
          }
        }
        else {
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0);
          if ((*ppFVar5)->ValueType != (PType *)TypeName) {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,"Name expected for parameter %d"
                       ,0);
            bVar1 = true;
          }
        }
      }
      else {
        ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                             (ulong)local_28);
        bVar2 = FxExpression::IsInteger(*ppFVar5);
        if (!bVar2) {
          sVar6 = (size_t)local_28;
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,sVar6);
          iVar3 = PType::GetRegType((*ppFVar5)->ValueType);
          if (iVar3 == 1) {
            this_01 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,sVar6);
            ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                 (ulong)local_28);
            FxIntCast::FxIntCast(this_01,*ppFVar5,(bool)(ctx->FromDecorate & 1),false);
            ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                                 (ulong)local_28);
            *ppFVar5 = (FxExpression *)this_01;
          }
          else {
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,
                       "Integer expected for parameter %d",(ulong)local_28);
            bVar1 = true;
          }
        }
      }
    }
    if (bVar1) {
      if (this != (FxActionSpecialCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxActionSpecialCall *)0x0;
    }
    else {
      (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxActionSpecialCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	bool failed = false;

	SAFE_RESOLVE_OPT(Self, ctx);
	for (unsigned i = 0; i < ArgList.Size(); i++)
	{
		ArgList[i] = ArgList[i]->Resolve(ctx);
		if (ArgList[i] == nullptr)
		{
			failed = true;
		}
		else if (Special < 0 && i == 0)
		{
			if (ArgList[i]->ValueType == TypeString)
			{
				ArgList[i] = new FxNameCast(ArgList[i]);
				ArgList[i] = ArgList[i]->Resolve(ctx);
				if (ArgList[i] == nullptr)
				{
					failed = true;
				}
			}
			else if (ArgList[i]->ValueType != TypeName)
			{
				ScriptPosition.Message(MSG_ERROR, "Name expected for parameter %d", i);
				failed = true;
			}
		}
		else if (!ArgList[i]->IsInteger())
		{
			if (ArgList[i]->ValueType->GetRegType() == REGT_FLOAT /* lax */)
			{
				ArgList[i] = new FxIntCast(ArgList[i], ctx.FromDecorate);
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Integer expected for parameter %d", i);
				failed = true;
			}
		}
	}
	if (failed)
	{
		delete this;
		return nullptr;
	}
	ValueType = TypeSInt32;
	return this;
}